

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_zeroing<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>>
               (void)

{
  uint uVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  pool<boost::default_user_allocator_malloc_free> *ppVar13;
  node_ptr next;
  _Hash_node_base *p_Var14;
  ulong uVar15;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  orderedBoundaries;
  Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>
  m;
  shared_count sStack_380;
  char *local_378;
  char *local_370;
  Delete_disposer local_368;
  undefined1 local_360;
  undefined8 *local_358;
  char **local_350;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_348;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  pool<boost::default_user_allocator_malloc_free> *local_210;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>
  local_208;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>>>
            ();
  local_210 = (pool<boost::default_user_allocator_malloc_free> *)operator_new(0x38);
  (((Entry_constructor *)&local_210->super_simple_segregated_storage<unsigned_long>)->entryPool_).
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (local_210->list).ptr = (char *)0x0;
  (local_210->list).sz = 0;
  local_210->requested_size = 0x20;
  local_210->next_size = 0x20;
  local_210->start_size = 0x20;
  local_210->max_size = 0;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>>
  ::RU_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>>
              *)&local_208,&local_348,(Column_settings *)local_210);
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x26d);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_208.reducedMatrixR_.matrix_._M_h._M_bucket_count;
  uVar15 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar5,0);
  if (local_208.reducedMatrixR_.matrix_._M_h._M_buckets[uVar15 & 0xffffffff] != (__node_base_ptr)0x0
     ) {
    p_Var2 = local_208.reducedMatrixR_.matrix_._M_h._M_buckets[uVar15 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        p_Var14 = p_Var2 + 7;
        goto LAB_0016a9df;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
            (ulong)uVar1 % local_208.reducedMatrixR_.matrix_._M_h._M_bucket_count == uVar15));
  }
  std::__throw_out_of_range("_Map_base::at");
  while (*(int *)&p_Var14[2]._M_nxt != 1) {
LAB_0016a9df:
    p_Var14 = p_Var14->_M_nxt;
    if (p_Var14 == p_Var2 + 7) break;
  }
  sStack_380.pi_ = (sp_counted_base *)0x0;
  local_378 = "!m.is_zero_entry(3, 1)";
  local_370 = "";
  local_360 = 0;
  local_368.col_ =
       (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>
        *)&PTR__lazy_ostream_00257fe8;
  local_358 = &boost::unit_test::lazy_ostream::inst;
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_238 = "";
  local_350 = &local_378;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_380);
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_250,0x26e);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_208.reducedMatrixR_.matrix_._M_h._M_bucket_count;
  uVar15 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar6,0);
  if (local_208.reducedMatrixR_.matrix_._M_h._M_buckets[uVar15 & 0xffffffff] != (__node_base_ptr)0x0
     ) {
    p_Var2 = local_208.reducedMatrixR_.matrix_._M_h._M_buckets[uVar15 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        sStack_380.pi_ = (sp_counted_base *)0x0;
        local_378 = "!m.is_zero_column(3)";
        local_370 = "";
        local_360 = 0;
        local_368.col_ =
             (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>
              *)&PTR__lazy_ostream_00257fe8;
        local_358 = &boost::unit_test::lazy_ostream::inst;
        local_270 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_268 = "";
        local_350 = &local_378;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_380);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = local_208.reducedMatrixR_.matrix_._M_h._M_bucket_count;
        uVar15 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar7,0);
        if (local_208.reducedMatrixR_.matrix_._M_h._M_buckets[uVar15 & 0xffffffff] ==
            (__node_base_ptr)0x0) goto LAB_0016b158;
        p_Var2 = local_208.reducedMatrixR_.matrix_._M_h._M_buckets[uVar15 & 0xffffffff]->_M_nxt;
        uVar1 = *(uint *)&p_Var2[1]._M_nxt;
        goto joined_r0x0016abc4;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
            (ulong)uVar1 % local_208.reducedMatrixR_.matrix_._M_h._M_bucket_count == uVar15));
  }
  std::__throw_out_of_range("_Map_base::at");
  while (*(int *)&p_Var14[2]._M_nxt != 1) {
LAB_0016abf6:
    p_Var14 = p_Var14->_M_nxt;
    if (p_Var14 == p_Var2 + 7) goto LAB_0016ac29;
  }
  p_Var3 = p_Var14->_M_nxt;
  p_Var4 = p_Var14[1]._M_nxt;
  p_Var4->_M_nxt = p_Var3;
  p_Var3[1]._M_nxt = p_Var4;
  p_Var14->_M_nxt = (_Hash_node_base *)0x0;
  p_Var14[1]._M_nxt = (_Hash_node_base *)0x0;
  local_368.col_ =
       (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>
        *)(p_Var2 + 2);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>
  ::Delete_disposer::operator()(&local_368,(Entry *)(p_Var14 + -1));
LAB_0016ac29:
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_280,0x270);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_208.reducedMatrixR_.matrix_._M_h._M_bucket_count;
  uVar15 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar8,0);
  if (local_208.reducedMatrixR_.matrix_._M_h._M_buckets[uVar15 & 0xffffffff] != (__node_base_ptr)0x0
     ) {
    p_Var2 = local_208.reducedMatrixR_.matrix_._M_h._M_buckets[uVar15 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        p_Var14 = p_Var2 + 7;
        goto LAB_0016acb9;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
            (ulong)uVar1 % local_208.reducedMatrixR_.matrix_._M_h._M_bucket_count == uVar15));
  }
  std::__throw_out_of_range("_Map_base::at");
  while (*(int *)&p_Var14[2]._M_nxt != 1) {
LAB_0016acb9:
    p_Var14 = p_Var14->_M_nxt;
    if (p_Var14 == p_Var2 + 7) break;
  }
  sStack_380.pi_ = (sp_counted_base *)0x0;
  local_378 = "m.is_zero_entry(3, 1)";
  local_370 = "";
  local_360 = 0;
  local_368.col_ =
       (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>
        *)&PTR__lazy_ostream_00257fe8;
  local_358 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_298 = "";
  local_350 = &local_378;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_380);
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2b0,0x271);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_208.reducedMatrixR_.matrix_._M_h._M_bucket_count;
  uVar15 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar9,0);
  if (local_208.reducedMatrixR_.matrix_._M_h._M_buckets[uVar15 & 0xffffffff] != (__node_base_ptr)0x0
     ) {
    p_Var2 = local_208.reducedMatrixR_.matrix_._M_h._M_buckets[uVar15 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        sStack_380.pi_ = (sp_counted_base *)0x0;
        local_378 = "!m.is_zero_column(3)";
        local_370 = "";
        local_360 = 0;
        local_368.col_ =
             (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>
              *)&PTR__lazy_ostream_00257fe8;
        local_358 = &boost::unit_test::lazy_ostream::inst;
        local_2d0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_2c8 = "";
        local_350 = &local_378;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_380);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = local_208.reducedMatrixR_.matrix_._M_h._M_bucket_count;
        uVar15 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar10,0);
        if (local_208.reducedMatrixR_.matrix_._M_h._M_buckets[uVar15 & 0xffffffff] ==
            (__node_base_ptr)0x0) goto LAB_0016b158;
        p_Var2 = local_208.reducedMatrixR_.matrix_._M_h._M_buckets[uVar15 & 0xffffffff]->_M_nxt;
        uVar1 = *(uint *)&p_Var2[1]._M_nxt;
        goto joined_r0x0016ae9b;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
            (ulong)uVar1 % local_208.reducedMatrixR_.matrix_._M_h._M_bucket_count == uVar15));
  }
  std::__throw_out_of_range("_Map_base::at");
  while ((p_Var2 = p_Var2->_M_nxt, p_Var2 != (_Hash_node_base *)0x0 &&
         (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
         (ulong)uVar1 % local_208.reducedMatrixR_.matrix_._M_h._M_bucket_count == uVar15))) {
joined_r0x0016abc4:
    if (uVar1 == 3) {
      p_Var14 = p_Var2 + 7;
      goto LAB_0016abf6;
    }
  }
LAB_0016b158:
  std::__throw_out_of_range("_Map_base::at");
joined_r0x0016ae9b:
  if (uVar1 != 3) {
    p_Var2 = p_Var2->_M_nxt;
    if ((p_Var2 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
       (ulong)uVar1 % local_208.reducedMatrixR_.matrix_._M_h._M_bucket_count != uVar15))
    goto LAB_0016b158;
    goto joined_r0x0016ae9b;
  }
  boost::intrusive::
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
  ::
  clear_and_dispose<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>>::Delete_disposer>
            ((list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
              *)(p_Var2 + 7),
             (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>
              *)(p_Var2 + 2));
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2e0,0x273);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_208.reducedMatrixR_.matrix_._M_h._M_bucket_count;
  uVar15 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar11,0);
  if (local_208.reducedMatrixR_.matrix_._M_h._M_buckets[uVar15 & 0xffffffff] == (__node_base_ptr)0x0
     ) goto LAB_0016b194;
  p_Var2 = local_208.reducedMatrixR_.matrix_._M_h._M_buckets[uVar15 & 0xffffffff]->_M_nxt;
  uVar1 = *(uint *)&p_Var2[1]._M_nxt;
  while (uVar1 != 3) {
    p_Var2 = p_Var2->_M_nxt;
    if ((p_Var2 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
       (ulong)uVar1 % local_208.reducedMatrixR_.matrix_._M_h._M_bucket_count != uVar15)) {
LAB_0016b194:
      std::__throw_out_of_range("_Map_base::at");
    }
  }
  p_Var14 = p_Var2 + 7;
  do {
    p_Var14 = p_Var14->_M_nxt;
    if (p_Var14 == p_Var2 + 7) break;
  } while (*(int *)&p_Var14[2]._M_nxt != 1);
  sStack_380.pi_ = (sp_counted_base *)0x0;
  local_378 = "m.is_zero_entry(3, 1)";
  local_370 = "";
  local_360 = 0;
  local_368.col_ =
       (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>
        *)&PTR__lazy_ostream_00257fe8;
  local_358 = &boost::unit_test::lazy_ostream::inst;
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2f8 = "";
  local_350 = &local_378;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_380);
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_310,0x274);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_208.reducedMatrixR_.matrix_._M_h._M_bucket_count;
  uVar15 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar12,0);
  if (local_208.reducedMatrixR_.matrix_._M_h._M_buckets[uVar15 & 0xffffffff] != (__node_base_ptr)0x0
     ) {
    p_Var2 = local_208.reducedMatrixR_.matrix_._M_h._M_buckets[uVar15 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        sStack_380.pi_ = (sp_counted_base *)0x0;
        local_378 = "m.is_zero_column(3)";
        local_370 = "";
        local_360 = 0;
        local_368.col_ =
             (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>
              *)&PTR__lazy_ostream_00257fe8;
        local_358 = &boost::unit_test::lazy_ostream::inst;
        local_330 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_328 = "";
        local_350 = &local_378;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_380);
        Gudhi::persistence_matrix::
        RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>
        ::reset(&local_208,(Column_settings *)local_210);
        ppVar13 = local_210;
        if (local_210 != (pool<boost::default_user_allocator_malloc_free> *)0x0) {
          boost::pool<boost::default_user_allocator_malloc_free>::purge_memory(local_210);
        }
        operator_delete(ppVar13,0x38);
        Gudhi::persistence_matrix::
        RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>
        ::~RU_matrix(&local_208);
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::~vector(&local_348);
        return;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
            (ulong)uVar1 % local_208.reducedMatrixR_.matrix_._M_h._M_bucket_count == uVar15));
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

void test_zeroing() {
  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();

  Matrix m(orderedBoundaries, 5);

  BOOST_CHECK(!m.is_zero_entry(3, 1));
  BOOST_CHECK(!m.is_zero_column(3));
  m.zero_entry(3, 1);
  BOOST_CHECK(m.is_zero_entry(3, 1));
  BOOST_CHECK(!m.is_zero_column(3));
  m.zero_column(3);
  BOOST_CHECK(m.is_zero_entry(3, 1));
  BOOST_CHECK(m.is_zero_column(3));
}